

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leb128.cc
# Opt level: O3

Offset wabt::WriteFixedU32Leb128At(Stream *stream,Offset offset,uint32_t value,char *desc)

{
  uint local_10;
  byte local_c;
  
  local_10 = value & 0xff | (value >> 7 & 0xff) << 8 | (value >> 0xe & 0xff) << 0x10 |
             (value >> 0x15) << 0x18 | (uint)DAT_011d4670;
  local_c = (byte)(value >> 0x1c);
  Stream::WriteDataAt(stream,offset,&local_10,5,desc,No);
  return 5;
}

Assistant:

Offset WriteFixedU32Leb128At(Stream* stream,
                             Offset offset,
                             uint32_t value,
                             const char* desc) {
  uint8_t data[MAX_U32_LEB128_BYTES];
  Offset length =
      WriteFixedU32Leb128Raw(data, data + MAX_U32_LEB128_BYTES, value);
  stream->WriteDataAt(offset, data, length, desc);
  return length;
}